

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcs.cc
# Opt level: O1

int __thiscall dcs::FileHeader::readFrom(FileHeader *this,char *buf,size_t len)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *piVar2;
  long lVar3;
  runtime_error *prVar4;
  int *in_R9;
  string local_60;
  int local_3c;
  undefined8 local_38;
  
  if (len < 0x20) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_38._0_4_ = 0x10;
    util::str<char[42],char[85],char[2],int>
              (&local_60,(util *)"Assertion `(len - nread) >= n` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])&local_38,in_R9);
    std::runtime_error::runtime_error(prVar4,(string *)&local_60);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,buf,buf + 0x20);
  std::__cxx11::string::operator=((string *)this,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((len & 0xfffffffffffffff8) == 0x20) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_38._0_4_ = 0x18;
    util::str<char[42],char[85],char[2],int>
              (&local_60,(util *)"Assertion `(len - nread) >= n` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])&local_38,in_R9);
    std::runtime_error::runtime_error(prVar4,(string *)&local_60);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_60.field_2._M_allocated_capacity = *(undefined8 *)(buf + 0x20);
  local_60._M_string_length = 8;
  local_60.field_2._M_local_buf[8] = '\0';
  local_60._M_dataplus._M_p = (pointer)paVar1;
  piVar2 = __errno_location();
  local_3c = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(paVar1->_M_local_buf,(char **)&local_38,10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_38._4_4_,(undefined4)local_38) == paVar1) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)(uint32_t)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = local_3c;
    }
    this->length = (uint32_t)lVar3;
    paVar1 = &local_60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (len - 0x3c < 0xffffffffffffffec) {
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,buf + 0x28,buf + 0x3c);
      std::__cxx11::string::operator=((string *)&this->misc1,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (len - 0x44 < 0xfffffffffffffff8) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->misc2,8);
        *(undefined8 *)
         (this->misc2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start = *(undefined8 *)(buf + 0x3c);
        return 0x44;
      }
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_38._0_4_ = 0x28;
      util::str<char[42],char[85],char[2],int>
                (&local_60,(util *)"Assertion `(len - nread) >= n` failed at ",
                 (char (*) [42])
                 "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
                 ,(char (*) [85])":",(char (*) [2])&local_38,in_R9);
      std::runtime_error::runtime_error(prVar4,(string *)&local_60);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_0010a863;
  }
  std::__throw_out_of_range("stoi");
LAB_0010a863:
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_38._0_4_ = 0x20;
  util::str<char[42],char[85],char[2],int>
            (&local_60,(util *)"Assertion `(len - nread) >= n` failed at ",
             (char (*) [42])
             "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc",
             (char (*) [85])":",(char (*) [2])&local_38,in_R9);
  std::runtime_error::runtime_error(prVar4,(string *)&local_60);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int FileHeader::readFrom(const char* buf, size_t len) {
  size_t nread = 0;

  // 32 bytes hold the DCS file name (and trailing spaces)
  {
    constexpr unsigned n = 32;
    ASSERT((len - nread) >= n);
    name = std::string(buf + nread, n);
    nread += n;
  }

  // 8 bytes holding length of payload
  {
    constexpr unsigned n = 8;
    ASSERT((len - nread) >= n);
    length = std::stoi(std::string(buf + nread, n));
    nread += n;
  }

  // 20 bytes holding some ASCII data
  {
    constexpr unsigned n = 20;
    ASSERT((len - nread) >= n);
    misc1 = std::string(buf + nread, n);
    nread += n;
  }

  // 8 bytes holding some binary data
  {
    constexpr unsigned n = 8;
    ASSERT((len - nread) >= n);
    misc2.resize(n);
    memcpy(misc2.data(), &buf[nread], n);
    nread += n;
  }

  return nread;
}